

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void telnet_send(Backend *be,char *buf,size_t len)

{
  Backend *pBVar1;
  uchar *puVar2;
  Interactor *pIVar3;
  uchar *puVar4;
  bool bVar5;
  uchar *q;
  uchar *end;
  uchar *p;
  Telnet *telnet;
  size_t len_local;
  char *buf_local;
  Backend *be_local;
  
  pBVar1 = be + -10;
  if (pBVar1->vt != (BackendVtable *)0x0) {
    puVar2 = (uchar *)(buf + len);
    end = (uchar *)buf;
    while (puVar4 = end, end < puVar2) {
      while( true ) {
        bVar5 = false;
        if (((end < puVar2) && (bVar5 = false, *end != 0xff)) &&
           (bVar5 = true, *(int *)&be[-5].interactor != 1)) {
          bVar5 = *end != '\r';
        }
        if (!bVar5) break;
        end = end + 1;
      }
      pIVar3 = (Interactor *)sk_write((Socket *)pBVar1->vt,puVar4,(long)end - (long)puVar4);
      be[-4].interactor = pIVar3;
      while( true ) {
        bVar5 = false;
        if (end < puVar2) {
          bVar5 = false;
          if ((*end != 0xff) && (bVar5 = true, *(int *)&be[-5].interactor != 1)) {
            bVar5 = *end != '\r';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        if (!bVar5) break;
        puVar4 = "\r";
        if (*end == 0xff) {
          puVar4 = telnet_send::iac;
        }
        pIVar3 = (Interactor *)sk_write((Socket *)pBVar1->vt,puVar4,2);
        be[-4].interactor = pIVar3;
        end = end + 1;
      }
    }
  }
  return;
}

Assistant:

static void telnet_send(Backend *be, const char *buf, size_t len)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char *p, *end;
    static const unsigned char iac[2] = { IAC, IAC };
    static const unsigned char cr[2] = { CR, NUL };
#if 0
    static const unsigned char nl[2] = { CR, LF };
#endif

    if (telnet->s == NULL)
        return;

    p = (unsigned char *)buf;
    end = (unsigned char *)(buf + len);
    while (p < end) {
        unsigned char *q = p;

        while (p < end && iswritable(*p))
            p++;
        telnet->bufsize = sk_write(telnet->s, q, p - q);

        while (p < end && !iswritable(*p)) {
            telnet->bufsize =
                sk_write(telnet->s, *p == IAC ? iac : cr, 2);
            p++;
        }
    }
}